

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O0

int AF_A_Punch(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  DObject *this_00;
  int iVar1;
  APowerStrength *pAVar2;
  bool bVar3;
  bool local_ca;
  bool local_c7;
  FSoundID local_c4;
  FName local_c0;
  FName local_bc;
  TAngle<double> local_b8;
  TAngle<double> local_b0;
  TAngle<double> local_a8;
  undefined1 local_a0 [16];
  TAngle<double> local_90;
  AWeapon *local_88;
  AWeapon *weapon;
  FTranslatedLineTarget t;
  DAngle pitch;
  int damage;
  DAngle angle;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x1f,"int AF_A_Punch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x1f,"int AF_A_Punch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  local_c7 = true;
  if (this != (AActor *)0x0) {
    local_c7 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_c7 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x1f,"int AF_A_Punch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar3 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
      bVar3 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x1f,"int AF_A_Punch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_ca = true;
    if (this_00 != (DObject *)0x0) {
      local_ca = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_ca == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x1f,"int AF_A_Punch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
    angle.Degrees = 0.0;
  }
  else {
    bVar3 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, param[2].field_0.field_1.atag != 8)) {
      bVar3 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x1f,"int AF_A_Punch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    angle.Degrees = (double)param[2].field_0.field_1.a;
  }
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffa8);
  TAngle<double>::TAngle((TAngle<double> *)&t.unlinked);
  FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)&weapon);
  if ((((this->player == (player_t *)0x0) ||
       (local_88 = this->player->ReadyWeapon, local_88 == (AWeapon *)0x0)) ||
      ((*(uint *)&(local_88->super_AInventory).field_0x4dc & 0x10000) != 0)) ||
     (((this->player == (player_t *)0x0 || (angle.Degrees == 0.0)) ||
      ((*(int *)((long)angle.Degrees + 8) != 1 ||
       (bVar3 = AWeapon::DepleteAmmo(local_88,(bool)(local_88->bAltFire & 1),true,-1), bVar3)))))) {
    iVar1 = FRandom::operator()(&pr_punch);
    iVar1 = iVar1 % 10 + 1;
    pitch.Degrees._4_4_ = iVar1 * 2;
    pAVar2 = AActor::FindInventory<APowerStrength>(this);
    if (pAVar2 != (APowerStrength *)0x0) {
      pitch.Degrees._4_4_ = iVar1 * 0x14;
    }
    iVar1 = FRandom::Random2(&pr_punch);
    TAngle<double>::operator+(&local_90,(double)iVar1 * 0.02197265625);
    TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffa8,&local_90);
    TAngle<double>::TAngle((TAngle<double> *)local_a0,(TAngle<double> *)&stack0xffffffffffffffa8);
    TAngle<double>::TAngle(&local_a8,0.0);
    P_AimLineAttack((AActor *)(local_a0 + 8),(DAngle *)this,64.0,(FTranslatedLineTarget *)local_a0,
                    (DAngle *)0x0,(int)&local_a8,(AActor *)0x0,(AActor *)0x0);
    TAngle<double>::operator=((TAngle<double> *)&t.unlinked,(TAngle<double> *)(local_a0 + 8));
    TAngle<double>::TAngle(&local_b0,(TAngle<double> *)&stack0xffffffffffffffa8);
    TAngle<double>::TAngle(&local_b8,(TAngle<double> *)&t.unlinked);
    FName::FName(&local_bc,NAME_Melee);
    FName::FName(&local_c0,NAME_BulletPuff);
    P_LineAttack(this,&local_b0,64.0,&local_b8,pitch.Degrees._4_4_,&local_bc,&local_c0,1,
                 (FTranslatedLineTarget *)&weapon,(int *)0x0);
    if (weapon != (AWeapon *)0x0) {
      FSoundID::FSoundID(&local_c4,"*fist");
      S_Sound(this,1,&local_c4,1.0,1.0);
      TAngle<double>::operator=(&(this->Angles).Yaw,(TAngle<double> *)&t);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Punch)
{
	PARAM_ACTION_PROLOGUE;

	DAngle 	angle;
	int 		damage;
	DAngle 		pitch;
	FTranslatedLineTarget t;

	if (self->player != NULL)
	{
		AWeapon *weapon = self->player->ReadyWeapon;
		if (weapon != NULL && !(weapon->WeaponFlags & WIF_DEHAMMO) && ACTION_CALL_FROM_PSPRITE())
		{
			if (!weapon->DepleteAmmo (weapon->bAltFire))
				return 0;
		}
	}

	damage = (pr_punch()%10+1)<<1;

	if (self->FindInventory<APowerStrength>())	
		damage *= 10;

	angle = self->Angles.Yaw + pr_punch.Random2() * (5.625 / 256);
	pitch = P_AimLineAttack (self, angle, MELEERANGE);

	P_LineAttack (self, angle, MELEERANGE, pitch, damage, NAME_Melee, NAME_BulletPuff, LAF_ISMELEEATTACK, &t);

	// turn to face target
	if (t.linetarget)
	{
		S_Sound (self, CHAN_WEAPON, "*fist", 1, ATTN_NORM);
		self->Angles.Yaw = t.angleFromSource;
	}
	return 0;
}